

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O3

void dlep_writer_add_ipv6_conpoint_tlv(dlep_writer *writer,netaddr *addr,uint16_t port,_Bool tls)

{
  uint8_t value [19];
  undefined1 local_38;
  undefined1 local_37 [16];
  ushort local_27;
  
  if (addr->_type == '\n') {
    local_38 = tls;
    netaddr_to_binary(local_37,addr,0x13);
    local_27 = port << 8 | port >> 8;
    dlep_writer_add_tlv(writer,3,&local_38,0x13);
  }
  return;
}

Assistant:

void
dlep_writer_add_ipv6_conpoint_tlv(struct dlep_writer *writer, const struct netaddr *addr, uint16_t port, bool tls) {
  uint8_t value[19];

  if (netaddr_get_address_family(addr) != AF_INET6) {
    return;
  }

  /* convert port to network byte order */
  port = htons(port);

  /* copy data into value buffer */
  value[0] = tls ? DLEP_CONNECTION_TLS : DLEP_CONNECTION_PLAIN;
  netaddr_to_binary(&value[1], addr, sizeof(value));
  memcpy(&value[17], &port, sizeof(port));

  dlep_writer_add_tlv(writer, DLEP_IPV6_CONPOINT_TLV, &value, sizeof(value));
}